

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

QString * __thiscall
QDateTimeEdit::sectionText(QString *__return_storage_ptr__,QDateTimeEdit *this,Section section)

{
  QDateTimeEditPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((section == NoSection) ||
     (this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8,
     ((this_00->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
      super_QFlagsStorage<QDateTimeEdit::Section>.i & section) == NoSection)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (&QStack_48,this_00);
    QDateTimeEditPrivate::updateCache
              (this_00,&(this_00->super_QAbstractSpinBoxPrivate).value,(QString *)&QStack_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    QDateTimeEditPrivate::absoluteIndex(this_00,section,0);
    QDateTimeParser::sectionText((int)__return_storage_ptr__);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QDateTimeEdit::sectionText(Section section) const
{
    Q_D(const QDateTimeEdit);
    if (section == QDateTimeEdit::NoSection || !(section & d->sections)) {
        return QString();
    }

    d->updateCache(d->value, d->displayText());
    const int sectionIndex = d->absoluteIndex(section, 0);
    return d->sectionText(sectionIndex);
}